

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  MigrationSchema *pMVar7;
  uint32 *puVar8;
  Message *pMVar9;
  MessageFactory *pMVar10;
  Reflection *pRVar11;
  DescriptorPool *pDVar12;
  long lVar13;
  long lVar14;
  
  if (0 < *(int *)(descriptor + 0x70)) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      AssignMessageDescriptor(this,(Descriptor *)(*(long *)(descriptor + 0x38) + lVar14));
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x90;
    } while (lVar13 < *(int *)(descriptor + 0x70));
  }
  this->file_level_metadata_->descriptor = descriptor;
  pRVar11 = (Reflection *)operator_new(0x50);
  pMVar7 = this->schemas_;
  puVar8 = this->offsets_;
  lVar13._0_4_ = pMVar7->offsets_index;
  lVar13._4_4_ = pMVar7->has_bit_indices_index;
  iVar1 = pMVar7->object_size;
  pMVar9 = *this->default_instance_data_;
  lVar14 = lVar13 << 0x20;
  iVar2 = *(int *)((long)puVar8 + (lVar14 >> 0x1e));
  iVar3 = *(int *)((long)puVar8 + (lVar14 + 0x100000000 >> 0x1e));
  iVar4 = *(int *)((long)puVar8 + (lVar14 + 0x200000000 >> 0x1e));
  iVar5 = *(int *)((long)puVar8 + (lVar14 + 0x300000000 >> 0x1e));
  iVar6 = *(int *)((long)puVar8 + (lVar14 + 0x400000000 >> 0x1e));
  pDVar12 = DescriptorPool::internal_generated_pool();
  pMVar10 = this->factory_;
  pRVar11->descriptor_ = descriptor;
  (pRVar11->schema_).default_instance_ = pMVar9;
  (pRVar11->schema_).offsets_ = (uint32 *)((long)puVar8 + (lVar14 >> 0x1e) + 0x14);
  (pRVar11->schema_).has_bit_indices_ = puVar8 + (lVar13 >> 0x20);
  (pRVar11->schema_).has_bits_offset_ = iVar2;
  (pRVar11->schema_).metadata_offset_ = iVar3;
  (pRVar11->schema_).extensions_offset_ = iVar4;
  (pRVar11->schema_).oneof_case_offset_ = iVar5;
  (pRVar11->schema_).object_size_ = iVar1;
  (pRVar11->schema_).weak_field_map_offset_ = iVar6;
  if (pDVar12 == (DescriptorPool *)0x0) {
    pDVar12 = DescriptorPool::internal_generated_pool();
  }
  pRVar11->descriptor_pool_ = pDVar12;
  pRVar11->message_factory_ = pMVar10;
  pRVar11->last_non_weak_field_index_ = -1;
  pRVar11->last_non_weak_field_index_ = *(int *)(pRVar11->descriptor_ + 0x68) + -1;
  this->file_level_metadata_->reflection = pRVar11;
  iVar1 = *(int *)(descriptor + 0x74);
  if (0 < (long)iVar1) {
    lVar13 = 0;
    do {
      *this->file_level_enum_descriptors_ =
           (EnumDescriptor *)(*(long *)(descriptor + 0x40) + lVar13);
      this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
      lVar13 = lVar13 + 0x50;
    } while ((long)iVar1 * 0x50 != lVar13);
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = this->file_level_metadata_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    file_level_metadata_->reflection =
        new Reflection(descriptor,
                       MigrationToReflectionSchema(default_instance_data_,
                                                   offsets_, *schemas_),
                       DescriptorPool::internal_generated_pool(), factory_);
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
    file_level_metadata_++;
  }